

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O0

void __thiscall
FluidSynthMIDIDevice::FluidSettingInt(FluidSynthMIDIDevice *this,char *setting,int value)

{
  fluid_synth_t *pfVar1;
  int iVar2;
  int iVar3;
  _func_int_fluid_synth_t_ptr_int_int *p_Var4;
  _func_int_fluid_synth_t_ptr_int *p_Var5;
  _func_void_fluid_synth_t_ptr_double_double_double_double *p_Var6;
  _func_void_fluid_synth_t_ptr_int_double_double_double_int *p_Var7;
  _func_int_fluid_settings_t_ptr_char_ptr_int *p_Var8;
  _func_void_fluid_synth_t_ptr_int *p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int value_local;
  char *setting_local;
  FluidSynthMIDIDevice *this_local;
  
  if ((this->FluidSynth != (fluid_synth_t *)0x0) && (this->FluidSettings != (fluid_settings_t *)0x0)
     ) {
    iVar2 = strcmp(setting,"synth.interpolation");
    if (iVar2 == 0) {
      p_Var4 = ::TReqProc::operator_cast_to_function_pointer
                         ((TReqProc *)&fluid_synth_set_interp_method);
      iVar2 = (*p_Var4)(this->FluidSynth,-1,value);
      if (iVar2 != 0) {
        Printf("Setting interpolation method %d failed.\n",(ulong)(uint)value);
      }
    }
    else {
      iVar2 = strcmp(setting,"synth.polyphony");
      if (iVar2 == 0) {
        p_Var5 = ::TReqProc::operator_cast_to_function_pointer
                           ((TReqProc *)&fluid_synth_set_polyphony);
        iVar2 = (*p_Var5)(this->FluidSynth,value);
        if (iVar2 != 0) {
          Printf("Setting polyphony to %d failed.\n",(ulong)(uint)value);
        }
      }
      else {
        iVar2 = strcmp(setting,"z.reverb-changed");
        if (iVar2 == 0) {
          p_Var6 = ::TReqProc::operator_cast_to_function_pointer
                             ((TReqProc *)&fluid_synth_set_reverb);
          pfVar1 = this->FluidSynth;
          fVar10 = FFloatCVar::operator_cast_to_float(&fluid_reverb_roomsize);
          fVar11 = FFloatCVar::operator_cast_to_float(&fluid_reverb_damping);
          fVar12 = FFloatCVar::operator_cast_to_float(&fluid_reverb_width);
          fVar13 = FFloatCVar::operator_cast_to_float(&fluid_reverb_level);
          (*p_Var6)(pfVar1,(double)fVar10,(double)fVar11,(double)fVar12,(double)fVar13);
        }
        else {
          iVar2 = strcmp(setting,"z.chorus-changed");
          if (iVar2 == 0) {
            p_Var7 = ::TReqProc::operator_cast_to_function_pointer
                               ((TReqProc *)&fluid_synth_set_chorus);
            pfVar1 = this->FluidSynth;
            iVar2 = FIntCVar::operator_cast_to_int(&fluid_chorus_voices);
            fVar10 = FFloatCVar::operator_cast_to_float(&fluid_chorus_level);
            fVar11 = FFloatCVar::operator_cast_to_float(&fluid_chorus_speed);
            fVar12 = FFloatCVar::operator_cast_to_float(&fluid_chorus_depth);
            iVar3 = FIntCVar::operator_cast_to_int(&fluid_chorus_type);
            (*p_Var7)(pfVar1,iVar2,(double)fVar10,(double)fVar11,(double)fVar12,iVar3);
          }
          else {
            p_Var8 = ::TReqProc::operator_cast_to_function_pointer
                               ((TReqProc *)&fluid_settings_setint);
            iVar2 = (*p_Var8)(this->FluidSettings,setting,value);
            if (iVar2 == 0) {
              Printf("Failed to set %s to %d.\n",setting,(ulong)(uint)value);
            }
            else {
              iVar2 = strcmp(setting,"synth.reverb.active");
              if (iVar2 == 0) {
                p_Var9 = ::TReqProc::operator_cast_to_function_pointer
                                   ((TReqProc *)&fluid_synth_set_reverb_on);
                (*p_Var9)(this->FluidSynth,value);
              }
              else {
                iVar2 = strcmp(setting,"synth.chorus.active");
                if (iVar2 == 0) {
                  p_Var9 = ::TReqProc::operator_cast_to_function_pointer
                                     ((TReqProc *)&fluid_synth_set_chorus_on);
                  (*p_Var9)(this->FluidSynth,value);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FluidSynthMIDIDevice::FluidSettingInt(const char *setting, int value)
{
	if (FluidSynth == NULL || FluidSettings == NULL)
	{
		return;
	}

	if (strcmp(setting, "synth.interpolation") == 0)
	{
		if (FLUID_OK != fluid_synth_set_interp_method(FluidSynth, -1, value))
		{
			Printf("Setting interpolation method %d failed.\n", value);
		}
	}
	else if (strcmp(setting, "synth.polyphony") == 0)
	{
		if (FLUID_OK != fluid_synth_set_polyphony(FluidSynth, value))
		{
			Printf("Setting polyphony to %d failed.\n", value);
		}
	}
	else if (strcmp(setting, "z.reverb-changed") == 0)
	{
		fluid_synth_set_reverb(FluidSynth, fluid_reverb_roomsize, fluid_reverb_damping,
			fluid_reverb_width, fluid_reverb_level);
	}
	else if (strcmp(setting, "z.chorus-changed") == 0)
	{
		fluid_synth_set_chorus(FluidSynth, fluid_chorus_voices, fluid_chorus_level,
			fluid_chorus_speed, fluid_chorus_depth, fluid_chorus_type);
	}
	else if (0 == fluid_settings_setint(FluidSettings, setting, value))
	{
		Printf("Failed to set %s to %d.\n", setting, value);
	}
	// fluid_settings_setint succeeded; update these settings in the running synth, too
	else if (strcmp(setting, "synth.reverb.active") == 0)
	{
		fluid_synth_set_reverb_on(FluidSynth, value);
	}
	else if (strcmp(setting, "synth.chorus.active") == 0)
	{
		fluid_synth_set_chorus_on(FluidSynth, value);
	}
}